

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffDeclGroup(NodeDiffComputer *this,DeclGroup *lhs,DeclGroup *rhs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int32_t i;
  ulong uVar4;
  
  uVar1 = (lhs->_decls)._size;
  iVar2 = uVar1 - (rhs->_decls)._size;
  if (iVar2 == 0) {
    uVar4 = 0;
    iVar3 = 0;
    while ((iVar2 = iVar3, uVar4 < uVar1 &&
           (iVar2 = diffVarDecl(this,(lhs->_decls)._vals[uVar4],(rhs->_decls)._vals[uVar4]),
           iVar2 <= this->limit))) {
      iVar3 = iVar3 + iVar2;
      uVar4 = uVar4 + 1;
      uVar1 = (lhs->_decls)._size;
    }
  }
  else {
    iVar3 = -iVar2;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    iVar2 = iVar3 * (this->DiffCosts).SizeDiffCoeff + (this->DiffCosts).SizeDiffCost;
  }
  return iVar2;
}

Assistant:

int32_t diffDeclGroup(const DeclGroup *lhs, const DeclGroup *rhs) {
    const auto &leftGroup = lhs->declarations();
    const auto &rightGroup = rhs->declarations();

    if (leftGroup.size() != rightGroup.size())
      return sizeDiff(leftGroup.size(), rightGroup.size());

    int32_t result = 0;

    for (int32_t i = 0; i < leftGroup.size(); ++i) {
      const VarDecl *l = leftGroup[i];
      const VarDecl *r = rightGroup[i];

      int32_t tmp = diffVarDecl(l, r);

      if (tmp > limit)
        return tmp;

      result += tmp;
    }

    return result;
  }